

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O3

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc **ppsVar1;
  stbi__uint32 x;
  stbi__uint32 y;
  stbi__context *s;
  byte *pbVar2;
  stbi__context *psVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  stbi_uc sVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int depth;
  int iVar15;
  stbi_uc *psVar16;
  stbi_uc *psVar17;
  char *pcVar18;
  stbi_uc *psVar19;
  size_t sVar20;
  stbi_uc *psVar21;
  uint uVar22;
  byte bVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  byte bVar27;
  uint uVar28;
  stbi__uint16 *tc_00;
  ulong uVar29;
  stbi__png *z_00;
  int out_n;
  ulong uVar30;
  uint uVar31;
  long in_FS_OFFSET;
  ulong local_4e0;
  ulong local_4d8;
  stbi_uc tc [3];
  size_t local_490;
  stbi__uint32 local_478;
  stbi_uc *local_468;
  stbi__uint32 raw_len;
  ulong local_450;
  stbi__uint16 tc16 [3];
  stbi_uc palette [1024];
  
  tc[2] = '\0';
  tc[0] = '\0';
  tc[1] = '\0';
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar9 = stbi__check_png_header(s);
  if (iVar9 == 0) {
    return 0;
  }
  if (scan == 1) {
    return 1;
  }
  ppsVar1 = &z->idata;
  psVar19 = s->buffer_start;
  psVar21 = s->buffer_start + 1;
  bVar4 = true;
  bVar8 = 0;
  uVar13 = 0;
  bVar5 = false;
  uVar22 = 0;
  local_490 = 0;
  local_4e0 = 0;
  bVar6 = false;
  bVar27 = 0;
LAB_0014d0aa:
  iVar9 = stbi__get16be(s);
  uVar10 = stbi__get16be(s);
  uVar31 = iVar9 * 0x10000 + uVar10;
  uVar11 = stbi__get16be(s);
  uVar12 = stbi__get16be(s);
  uVar24 = uVar11 << 0x10 | uVar12;
  uVar25 = (uint)local_4e0;
  if ((int)uVar24 < 0x49484452) {
    if (uVar24 == 0x43674249) {
      bVar5 = true;
LAB_0014d528:
      stbi__skip(s,uVar31);
      goto LAB_0014d53a;
    }
    if (uVar24 != 0x49444154) {
      if (uVar24 != 0x49454e44) goto LAB_0014d50d;
      if (bVar4) goto LAB_0014d8b1;
      if (scan != 0) {
        return 1;
      }
      if (*ppsVar1 != (stbi_uc *)0x0) {
        raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
        psVar19 = (stbi_uc *)
                  stbi_zlib_decode_malloc_guesssize_headerflag
                            ((char *)*ppsVar1,uVar25,raw_len,(int *)&raw_len,(uint)!bVar5);
        z->expanded = psVar19;
        if (psVar19 == (stbi_uc *)0x0) {
          return 0;
        }
        free(z->idata);
        z->idata = (stbi_uc *)0x0;
        iVar9 = s->img_n + 1;
        iVar14 = s->img_n;
        if (bVar6) {
          iVar14 = iVar9;
        }
        out_n = iVar14;
        if (req_comp != 3) {
          out_n = iVar9;
        }
        if (bVar27 != 0) {
          out_n = iVar14;
        }
        if (iVar9 != req_comp) {
          out_n = iVar14;
        }
        s->img_out_n = out_n;
        local_468 = z->expanded;
        uVar22 = z->depth;
        local_450 = (ulong)uVar22;
        iVar9 = out_n << (uVar22 == 0x10);
        x = z->s->img_x;
        y = z->s->img_y;
        if (bVar8 == 0) {
          iVar9 = stbi__create_png_image_raw(z,local_468,raw_len,out_n,x,y,uVar22,uVar13);
          if (iVar9 == 0) {
            return 0;
          }
        }
        else {
          local_478 = raw_len;
          psVar19 = (stbi_uc *)stbi__malloc_mad3(x,y,iVar9,0);
          sVar20 = (size_t)iVar9;
          uVar30 = (ulong)(uint)(0 << (uVar22 == 0x10));
          do {
            psVar3 = z->s;
            uVar22 = (&DAT_00157de0)[uVar30];
            uVar25 = (&DAT_00157e20)[uVar30];
            uVar28 = ~uVar22 + psVar3->img_x + uVar25;
            uVar12 = uVar28 / uVar25;
            uVar10 = (&DAT_00157e00)[uVar30];
            uVar11 = (&DAT_00157e40)[uVar30];
            uVar31 = ~uVar10 + psVar3->img_y + uVar11;
            uVar24 = uVar31 / uVar11;
            if ((uVar25 <= uVar28) && (uVar11 <= uVar31)) {
              depth = (int)local_450;
              iVar14 = psVar3->img_n;
              iVar15 = stbi__create_png_image_raw
                                 (z,local_468,local_478,out_n,uVar12,uVar24,depth,uVar13);
              if (iVar15 == 0) {
                free(psVar19);
                return 0;
              }
              if (0 < (int)uVar24) {
                iVar15 = uVar10 * iVar9;
                local_4d8 = 0;
                do {
                  if (0 < (int)uVar12) {
                    psVar21 = z->out;
                    psVar16 = psVar19 + (ulong)(z->s->img_x * iVar15) + (long)(int)uVar22 * sVar20;
                    lVar26 = 0;
                    do {
                      memcpy(psVar16,psVar21 + (local_4d8 * (long)(int)uVar12 + lVar26) * sVar20,
                             sVar20);
                      lVar26 = lVar26 + 1;
                      psVar16 = psVar16 + (long)(int)uVar25 * sVar20;
                    } while (lVar26 < (int)uVar12);
                  }
                  local_4d8 = local_4d8 + 1;
                  iVar15 = iVar15 + uVar11 * iVar9;
                } while (local_4d8 < uVar24);
              }
              uVar24 = (((int)(uVar12 * depth * iVar14 + 7) >> 3) + 1) * uVar24;
              free(z->out);
              local_468 = local_468 + uVar24;
              local_478 = local_478 - uVar24;
            }
            uVar30 = uVar30 + 1;
          } while (uVar30 != 7);
          z->out = psVar19;
        }
        if (bVar6) {
          z_00 = (stbi__png *)(ulong)z->s->img_x;
          tc_00 = (stbi__uint16 *)(ulong)z->s->img_y;
          iVar9 = (int)z->out;
          if (z->depth == 0x10) {
            stbi__compute_transparency16(z_00,tc_00,iVar9);
          }
          else {
            stbi__compute_transparency(z_00,(stbi_uc *)tc_00,iVar9);
          }
        }
        if (((bVar5) && (stbi__de_iphone_flag != 0)) && (2 < s->img_out_n)) {
          stbi__de_iphone((stbi__png *)z->s);
        }
        if (bVar27 == 0) {
          if (bVar6) {
            s->img_n = s->img_n + 1;
          }
        }
        else {
          s->img_n = (uint)bVar27;
          uVar22 = (uint)bVar27;
          if (2 < req_comp) {
            uVar22 = req_comp;
          }
          s->img_out_n = uVar22;
          psVar19 = z->out;
          uVar13 = z->s->img_y * z->s->img_x;
          psVar21 = (stbi_uc *)stbi__malloc_mad2(uVar13,uVar22,0);
          if (psVar21 == (stbi_uc *)0x0) {
LAB_0014de29:
            *(char **)(in_FS_OFFSET + -0x10) = "outofmem";
            return 0;
          }
          if (uVar22 == 3) {
            if (uVar13 != 0) {
              uVar30 = 0;
              psVar16 = psVar21;
              do {
                uVar29 = (ulong)psVar19[uVar30];
                *psVar16 = palette[uVar29 * 4];
                psVar16[1] = palette[uVar29 * 4 + 1];
                psVar16[2] = palette[uVar29 * 4 + 2];
                psVar16 = psVar16 + 3;
                uVar30 = uVar30 + 1;
              } while (uVar13 != uVar30);
            }
          }
          else if (uVar13 != 0) {
            uVar30 = 0;
            do {
              *(undefined4 *)(psVar21 + uVar30 * 4) =
                   *(undefined4 *)(palette + (ulong)psVar19[uVar30] * 4);
              uVar30 = uVar30 + 1;
            } while (uVar13 != uVar30);
          }
          free(psVar19);
          z->out = psVar21;
        }
        free(z->expanded);
        z->expanded = (stbi_uc *)0x0;
        stbi__get16be(s);
        stbi__get16be(s);
        return 1;
      }
      pcVar18 = "no IDAT";
      goto LAB_0014d8b8;
    }
    if (!bVar4) {
      if ((bVar27 == 0) || (uVar22 != 0)) {
        if (scan == 2) {
          s->img_n = (uint)bVar27;
          return 1;
        }
        uVar10 = uVar31 + uVar25;
        if ((int)uVar10 < (int)uVar25) {
          return 0;
        }
        if ((uint)local_490 < uVar10) {
          sVar20 = 0x1000;
          if (0x1000 < uVar31) {
            sVar20 = (ulong)uVar31;
          }
          if ((uint)local_490 != 0) {
            sVar20 = local_490;
          }
          do {
            local_490 = sVar20;
            sVar20 = (ulong)((uint)local_490 * 2);
          } while ((uint)local_490 < uVar10);
          psVar16 = (stbi_uc *)realloc(*ppsVar1,local_490);
          if (psVar16 == (stbi_uc *)0x0) goto LAB_0014de29;
          *ppsVar1 = psVar16;
        }
        else {
          psVar16 = *ppsVar1;
        }
        iVar9 = stbi__getn(s,psVar16 + local_4e0,uVar31);
        bVar4 = false;
        uVar25 = uVar10;
        if (iVar9 != 0) goto LAB_0014d53a;
        pcVar18 = "outofdata";
      }
      else {
        pcVar18 = "no PLTE";
      }
      goto LAB_0014d8b8;
    }
  }
  else {
    if (uVar24 == 0x74524e53) {
      if (bVar4) goto LAB_0014d8b1;
      if (*ppsVar1 != (stbi_uc *)0x0) {
        pcVar18 = "tRNS after IDAT";
        goto LAB_0014d8b8;
      }
      if (bVar27 == 0) {
        uVar10 = s->img_n;
        if ((uVar10 & 1) == 0) {
          pcVar18 = "tRNS with alpha";
          goto LAB_0014d8b8;
        }
        if (uVar10 * 2 != uVar31) {
LAB_0014d933:
          pcVar18 = "bad tRNS len";
          goto LAB_0014d8b8;
        }
        if (z->depth == 0x10) {
          if (0 < (int)uVar10) {
            lVar26 = 0;
            do {
              iVar9 = stbi__get16be(s);
              tc16[lVar26] = (stbi__uint16)iVar9;
              lVar26 = lVar26 + 1;
            } while (lVar26 < s->img_n);
          }
        }
        else if (0 < (int)uVar10) {
          lVar26 = 0;
          do {
            iVar9 = stbi__get16be(s);
            tc[lVar26] = ""[z->depth] * (char)iVar9;
            lVar26 = lVar26 + 1;
          } while (lVar26 < s->img_n);
        }
        bVar6 = true;
        bVar4 = false;
        bVar27 = 0;
      }
      else {
        if (scan == 2) {
          s->img_n = 4;
          return 1;
        }
        if (uVar22 == 0) {
          pcVar18 = "tRNS before PLTE";
          goto LAB_0014d8b8;
        }
        if (uVar22 < uVar31) goto LAB_0014d933;
        bVar27 = 4;
        bVar4 = false;
        if (uVar31 != 0) {
          psVar16 = s->img_buffer;
          psVar17 = s->img_buffer_end;
          uVar30 = 0;
          do {
            if (psVar16 < psVar17) {
              s->img_buffer = psVar16 + 1;
              bVar23 = *psVar16;
              psVar16 = psVar16 + 1;
            }
            else if (s->read_from_callbacks == 0) {
              bVar23 = 0;
            }
            else {
              iVar14 = (*(s->io).read)(s->io_user_data,(char *)psVar19,s->buflen);
              if (iVar14 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                bVar23 = 0;
                psVar17 = psVar21;
              }
              else {
                bVar23 = *psVar19;
                psVar17 = psVar19 + iVar14;
              }
              s->img_buffer_end = psVar17;
              s->img_buffer = psVar21;
              psVar16 = psVar21;
            }
            palette[uVar30 * 4 + 3] = bVar23;
            uVar30 = uVar30 + 1;
          } while (uVar10 + iVar9 * 0x10000 != uVar30);
        }
      }
LAB_0014d53a:
      stbi__get16be(s);
      stbi__get16be(s);
      local_4e0 = (ulong)uVar25;
      goto LAB_0014d0aa;
    }
    if (uVar24 == 0x504c5445) {
      if (!bVar4) {
        if ((uVar31 < 0x301) && (uVar22 = uVar10 * 0xaaab >> 0x11, uVar22 * 3 == uVar31)) {
          bVar4 = false;
          if (2 < uVar10) {
            psVar16 = s->img_buffer;
            psVar17 = s->img_buffer_end;
            uVar30 = 0;
            do {
              if (psVar16 < psVar17) {
                s->img_buffer = psVar16 + 1;
                bVar23 = *psVar16;
                psVar16 = psVar16 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                bVar23 = 0;
              }
              else {
                iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar19,s->buflen);
                if (iVar9 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  bVar23 = 0;
                  psVar17 = psVar21;
                }
                else {
                  bVar23 = *psVar19;
                  psVar17 = psVar19 + iVar9;
                }
                s->img_buffer_end = psVar17;
                s->img_buffer = psVar21;
                psVar16 = psVar21;
              }
              palette[uVar30 * 4] = bVar23;
              if (psVar16 < psVar17) {
                s->img_buffer = psVar16 + 1;
                bVar23 = *psVar16;
                psVar16 = psVar16 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                bVar23 = 0;
              }
              else {
                iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar19,s->buflen);
                if (iVar9 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  bVar23 = 0;
                  psVar17 = psVar21;
                }
                else {
                  bVar23 = *psVar19;
                  psVar17 = psVar19 + iVar9;
                }
                s->img_buffer_end = psVar17;
                s->img_buffer = psVar21;
                psVar16 = psVar21;
              }
              palette[uVar30 * 4 + 1] = bVar23;
              if (psVar16 < psVar17) {
                s->img_buffer = psVar16 + 1;
                bVar23 = *psVar16;
                psVar16 = psVar16 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                bVar23 = 0;
              }
              else {
                iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar19,s->buflen);
                if (iVar9 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  bVar23 = 0;
                  psVar17 = psVar21;
                }
                else {
                  bVar23 = *psVar19;
                  psVar17 = psVar19 + iVar9;
                }
                s->img_buffer_end = psVar17;
                s->img_buffer = psVar21;
                psVar16 = psVar21;
              }
              palette[uVar30 * 4 + 2] = bVar23;
              palette[uVar30 * 4 + 3] = 0xff;
              uVar30 = uVar30 + 1;
            } while (uVar22 != uVar30);
          }
          goto LAB_0014d53a;
        }
        pcVar18 = "invalid PLTE";
        goto LAB_0014d8b8;
      }
    }
    else {
      if (uVar24 == 0x49484452) {
        if (!bVar4) {
          pcVar18 = "multiple IHDR";
          goto LAB_0014d8b8;
        }
        if (uVar31 != 0xd) {
          pcVar18 = "bad IHDR len";
          goto LAB_0014d8b8;
        }
        iVar9 = stbi__get16be(s);
        uVar13 = stbi__get16be(s);
        uVar13 = uVar13 | iVar9 << 0x10;
        s->img_x = uVar13;
        if (0x1000000 < uVar13) {
LAB_0014d885:
          pcVar18 = "too large";
LAB_0014d8b8:
          *(char **)(in_FS_OFFSET + -0x10) = pcVar18;
          return 0;
        }
        iVar9 = stbi__get16be(s);
        uVar13 = stbi__get16be(s);
        uVar13 = uVar13 | iVar9 << 0x10;
        s->img_y = uVar13;
        if (0x1000000 < uVar13) goto LAB_0014d885;
        pbVar2 = s->img_buffer;
        psVar16 = s->img_buffer_end;
        if (pbVar2 < psVar16) {
          s->img_buffer = pbVar2 + 1;
          bVar8 = *pbVar2;
          psVar17 = pbVar2 + 1;
LAB_0014d68f:
          z->depth = (uint)bVar8;
          if ((bVar8 < 0x11) && ((0x10116U >> (bVar8 & 0x1f) & 1) != 0)) {
            if (psVar16 <= psVar17) {
              if (s->read_from_callbacks != 0) {
                iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar19,s->buflen);
                if (iVar9 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  uVar13 = 0;
                  psVar16 = psVar21;
                }
                else {
                  uVar13 = (uint)*psVar19;
                  psVar16 = psVar19 + iVar9;
                }
                s->img_buffer_end = psVar16;
                s->img_buffer = psVar21;
                psVar17 = psVar21;
                goto LAB_0014d719;
              }
              bVar23 = 0;
              uVar13 = 0;
              goto LAB_0014d74c;
            }
            s->img_buffer = psVar17 + 1;
            uVar13 = (uint)*psVar17;
            psVar17 = psVar17 + 1;
LAB_0014d719:
            bVar23 = (byte)uVar13;
            if (6 < bVar23) {
LAB_0014d8a0:
              pcVar18 = "bad ctype";
              goto LAB_0014d8b8;
            }
            if (bVar23 == 3) {
              if (z->depth == 0x10) goto LAB_0014d8a0;
              uVar13 = 3;
              bVar23 = 3;
              bVar27 = 3;
            }
            else if ((uVar13 & 1) != 0) goto LAB_0014d8a0;
LAB_0014d74c:
            if (psVar17 < psVar16) {
              s->img_buffer = psVar17 + 1;
              bVar8 = *psVar17;
LAB_0014d7af:
              if (bVar8 != 0) {
                pcVar18 = "bad comp method";
                goto LAB_0014d8b8;
              }
            }
            else if (s->read_from_callbacks != 0) {
              iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar19,s->buflen);
              if (iVar9 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                bVar8 = 0;
                psVar16 = psVar21;
              }
              else {
                bVar8 = *psVar19;
                psVar16 = psVar19 + iVar9;
              }
              s->img_buffer_end = psVar16;
              s->img_buffer = psVar21;
              goto LAB_0014d7af;
            }
            sVar7 = stbi__get8(s);
            if (sVar7 != '\0') {
              pcVar18 = "bad filter method";
              goto LAB_0014d8b8;
            }
            bVar8 = stbi__get8(s);
            if (1 < bVar8) {
              pcVar18 = "bad interlace method";
              goto LAB_0014d8b8;
            }
            uVar10 = s->img_x;
            if ((uVar10 == 0) || (uVar11 = s->img_y, uVar11 == 0)) {
              pcVar18 = "0-pixel image";
              goto LAB_0014d8b8;
            }
            if (bVar27 != 0) {
              s->img_n = 1;
              bVar4 = false;
              if (uVar11 <= (uint)(0x40000000 / (ulong)uVar10 >> 2)) goto LAB_0014d53a;
              goto LAB_0014d885;
            }
            uVar12 = (uint)(3 < bVar23) + (uVar13 & 2) + 1;
            s->img_n = uVar12;
            if ((uint)((0x40000000 / (ulong)uVar10) / (ulong)uVar12) < uVar11) goto LAB_0014d885;
            bVar4 = false;
            bVar27 = 0;
            if (scan == 2) {
              return 1;
            }
            goto LAB_0014d53a;
          }
        }
        else {
          if (s->read_from_callbacks != 0) {
            iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar19,s->buflen);
            if (iVar9 == 0) {
              s->read_from_callbacks = 0;
              s->buffer_start[0] = '\0';
              bVar8 = 0;
              psVar16 = psVar21;
            }
            else {
              bVar8 = *psVar19;
              psVar16 = psVar19 + iVar9;
            }
            s->img_buffer_end = psVar16;
            s->img_buffer = psVar21;
            psVar17 = psVar21;
            goto LAB_0014d68f;
          }
          z->depth = 0;
        }
        pcVar18 = "1/2/4/8/16-bit only";
        goto LAB_0014d8b8;
      }
LAB_0014d50d:
      if (!bVar4) {
        bVar4 = false;
        if ((uVar11 >> 0xd & 1) == 0) {
          stbi__parse_png_file::invalid_chunk[0] = (char)(uVar11 >> 8);
          stbi__parse_png_file::invalid_chunk[1] = (char)uVar11;
          stbi__parse_png_file::invalid_chunk[2] = (char)(uVar12 >> 8);
          stbi__parse_png_file::invalid_chunk[3] = (char)uVar12;
          *(char **)(in_FS_OFFSET + -0x10) = stbi__parse_png_file::invalid_chunk;
          return 0;
        }
        goto LAB_0014d528;
      }
    }
  }
LAB_0014d8b1:
  pcVar18 = "first not IHDR";
  goto LAB_0014d8b8;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s); if (s->img_x > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            s->img_y = stbi__get32be(s); if (s->img_y > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            // end of PNG chunk, read and skip CRC
            stbi__get32be(s);
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}